

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderGLImpl::GetResourceDesc
          (ShaderGLImpl *this,Uint32 Index,ShaderResourceDesc *ResourceDesc)

{
  undefined *puVar1;
  bool bVar2;
  Uint32 UVar3;
  DeviceFeatures *pDVar4;
  Char *pCVar5;
  element_type *this_00;
  undefined8 uVar6;
  ShaderResourceDesc SVar7;
  undefined1 local_a0 [8];
  string _msg;
  undefined8 local_78;
  undefined1 local_70 [8];
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  ShaderResourceDesc *ResourceDesc_local;
  Uint32 Index_local;
  ShaderGLImpl *this_local;
  
  msg.field_2._8_8_ = ResourceDesc;
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_Builder);
  if (bVar2) {
    FormatString<char[109]>
              ((string *)local_40,
               (char (*) [109])
               "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"GetResourceDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
               ,0x19a);
    std::__cxx11::string::~string((string *)local_40);
  }
  pDVar4 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetFeatures
                     (&((this->super_ShaderBase<Diligent::EngineGLImplTraits>).
                        super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                       .m_pDevice)->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
  if (pDVar4->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[87]>
              ((string *)local_a0,
               (char (*) [87])
               "Shader resource queries are not available when separate shader objects are unsupported"
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar6 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar6,0);
    }
    std::__cxx11::string::~string((string *)local_a0);
  }
  else {
    UVar3 = GetResourceCount(this);
    if (UVar3 <= Index) {
      FormatString<char[22]>((string *)local_70,(char (*) [22])0xe4e362);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"GetResourceDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                 ,0x19e);
      std::__cxx11::string::~string((string *)local_70);
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_pShaderResources);
    if (bVar2) {
      this_00 = std::
                __shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_pShaderResources);
      SVar7 = ShaderResourcesGL::GetResourceDesc(this_00,Index);
      _msg.field_2._8_8_ = SVar7.Name;
      *(undefined8 *)msg.field_2._8_8_ = _msg.field_2._8_8_;
      local_78 = SVar7._8_8_;
      *(undefined8 *)(msg.field_2._8_8_ + 8) = local_78;
    }
  }
  return;
}

Assistant:

void ShaderGLImpl::GetResourceDesc(Uint32 Index, ShaderResourceDesc& ResourceDesc) const
{
    DEV_CHECK_ERR(!m_Builder, "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");

    if (m_pDevice->GetFeatures().SeparablePrograms)
    {
        DEV_CHECK_ERR(Index < GetResourceCount(), "Index is out of range");
        if (m_pShaderResources)
            ResourceDesc = m_pShaderResources->GetResourceDesc(Index);
    }
    else
    {
        LOG_WARNING_MESSAGE("Shader resource queries are not available when separate shader objects are unsupported");
    }
}